

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptNativeIntArray::JavascriptNativeIntArray
          (JavascriptNativeIntArray *this,JavascriptNativeIntArray *instance,bool boxHead,
          bool deepCopy)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  SparseArraySegmentBase **ppSVar4;
  undefined4 *puVar5;
  SparseArraySegmentBase *pSVar6;
  bool deepCopy_local;
  bool boxHead_local;
  JavascriptNativeIntArray *instance_local;
  JavascriptNativeIntArray *this_local;
  
  JavascriptNativeArray::JavascriptNativeArray
            (&this->super_JavascriptNativeArray,&instance->super_JavascriptNativeArray,deepCopy);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01e01dd0;
  if (boxHead) {
    Js::JavascriptArray::InitBoxedInlineSegments<Js::JavascriptNativeIntArray>
              ((JavascriptArray *)this,instance,deepCopy);
  }
  else {
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptNativeArray).super_JavascriptArray.head);
    pSVar1 = *ppSVar4;
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(instance->super_JavascriptNativeArray).super_JavascriptArray.head);
    if (pSVar1 != *ppSVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2ff9,"(head == instance->head)","head == instance->head");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion.
                          lastUsedSegment);
    pSVar1 = *ppSVar4;
    pSVar6 = Js::JavascriptArray::GetLastUsedSegment((JavascriptArray *)instance);
    if (pSVar1 != pSVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2ffa,
                                  "(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment())"
                                  ,"segmentUnion.lastUsedSegment == instance->GetLastUsedSegment()")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

JavascriptNativeIntArray::JavascriptNativeIntArray(JavascriptNativeIntArray * instance, bool boxHead, bool deepCopy) :
        JavascriptNativeArray(instance, deepCopy)
    {
        if (boxHead)
        {
            InitBoxedInlineSegments(instance, deepCopy);
        }
        else
        {
            // Base class ctor should have copied these
            Assert(head == instance->head);
            Assert(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment());
        }
    }